

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrjpgcom.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  FILE *__stream;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  char *pcVar10;
  char *pcVar11;
  char *arg;
  FILE *__stream_00;
  long lVar12;
  long lVar13;
  int local_68;
  
  progname = *argv;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "wrjpgcom";
  }
  if (argc < 2) {
LAB_001014e1:
    usage();
LAB_001014e6:
    pcVar11 = "Missing ending quote mark";
  }
  else {
    sVar7 = 0;
    pcVar10 = (char *)0x1;
    bVar2 = true;
    __stream = (FILE *)0x0;
    pcVar11 = (char *)0x0;
    do {
      iVar3 = (int)sVar7;
      local_68 = (int)pcVar10;
      arg = argv[local_68];
      cVar1 = *arg;
      if (cVar1 != '-') break;
      arg = arg + 1;
      iVar3 = keymatch(arg,"replace",1);
      if (iVar3 == 0) {
        iVar3 = keymatch(arg,"cfile",2);
        if (iVar3 == 0) {
          iVar3 = keymatch(arg,"comment",1);
          if ((iVar3 == 0) || (local_68 = local_68 + 1, argc <= local_68)) goto LAB_001014e1;
          lVar13 = (long)local_68;
          pcVar11 = argv[lVar13];
          if (*pcVar11 == '\"') {
            arg = (char *)malloc(65000);
            if (arg == (char *)0x0) goto LAB_00101764;
            sVar7 = strlen(pcVar11);
            if (sVar7 - 0xfde6 < 0xffffffffffff0218) goto LAB_00101887;
            strcpy(arg,pcVar11 + 1);
            lVar12 = 0;
            while( true ) {
              sVar7 = strlen(arg);
              if (((int)sVar7 != 0) && (uVar6 = (int)sVar7 - 1, arg[uVar6] == '\"')) break;
              if ((argc + -1) - lVar13 == lVar12) goto LAB_001014e6;
              pcVar11 = argv[lVar13 + lVar12 + 1];
              sVar8 = strlen(pcVar11);
              if ((sVar8 + sVar7) - 0xfde6 < 0xffffffffffff0218) goto LAB_00101887;
              sVar7 = strlen(arg);
              (arg + sVar7)[0] = ' ';
              (arg + sVar7)[1] = '\0';
              strcat(arg,pcVar11);
              lVar12 = lVar12 + 1;
            }
            local_68 = local_68 + (int)lVar12;
            arg[uVar6] = '\0';
            pcVar11 = arg;
          }
          else {
            sVar7 = strlen(pcVar11);
            if (64999 < sVar7) goto LAB_00101887;
          }
          sVar7 = strlen(pcVar11);
        }
        else {
          local_68 = local_68 + 1;
          if (argc <= local_68) goto LAB_001014e1;
          arg = (char *)(long)local_68;
          __stream = fopen(argv[(long)arg],"r");
          if (__stream == (FILE *)0x0) goto LAB_0010158f;
        }
      }
      else {
        bVar2 = false;
      }
      iVar3 = (int)sVar7;
      pcVar10 = (char *)(ulong)(local_68 + 1U);
    } while ((int)(local_68 + 1U) < argc);
    if (((pcVar11 != (char *)0x0) && (__stream != (FILE *)0x0)) ||
       ((pcVar11 == (char *)0x0 && ((__stream == (FILE *)0x0 && (cVar1 == '-'))))))
    goto LAB_001014e1;
    iVar4 = (int)pcVar10;
    if (cVar1 != '-') {
      infile = (FILE *)fopen(argv[iVar4],"rb");
      arg = pcVar10;
      if ((FILE *)infile != (FILE *)0x0) goto LAB_00101565;
      pcVar11 = argv[iVar4];
LAB_001015a5:
      fprintf(_stderr,"%s: can\'t open %s\n",progname,pcVar11);
      goto LAB_001018a4;
    }
    infile = (FILE *)_stdin;
LAB_00101565:
    if (iVar4 < argc + -1) {
      fprintf(_stderr,"%s: only one input file\n",progname);
      usage();
LAB_0010158f:
      pcVar11 = argv[(long)arg];
      goto LAB_001015a5;
    }
    outfile = _stdout;
    if (pcVar11 == (char *)0x0) {
      pcVar11 = (char *)malloc(65000);
      if (pcVar11 != (char *)0x0) {
        __stream_00 = __stream;
        if (__stream == (FILE *)0x0) {
          __stream_00 = _stdin;
        }
        iVar3 = getc(__stream_00);
        lVar13 = 0;
        if (iVar3 != -1) {
          lVar13 = 0;
          do {
            if (lVar13 == 65000) goto LAB_00101887;
            pcVar11[lVar13] = (char)iVar3;
            lVar13 = lVar13 + 1;
            iVar3 = getc(__stream_00);
          } while (iVar3 != -1);
        }
        iVar3 = (int)lVar13;
        if (__stream != (FILE *)0x0) {
          fclose(__stream);
        }
        goto LAB_001015d2;
      }
LAB_00101764:
      pcVar11 = "Insufficient memory";
    }
    else {
LAB_001015d2:
      iVar4 = getc((FILE *)infile);
      iVar5 = getc((FILE *)infile);
      if ((iVar4 == 0xff) && (iVar5 == 0xd8)) {
        putc(0xff,(FILE *)outfile);
        putc(0xd8,(FILE *)outfile);
LAB_00101638:
        iVar5 = read_1_byte();
        iVar4 = iVar5;
        while (iVar4 != 0xff) {
          iVar4 = read_1_byte();
        }
        do {
          iVar4 = read_1_byte();
        } while (iVar4 == 0xff);
        if (iVar5 != 0xff) {
          fwrite("Warning: garbage data found in JPEG file\n",0x29,1,_stderr);
        }
        uVar9 = (ulong)(iVar4 - 0xc0U);
        if (0x3e < iVar4 - 0xc0U) {
LAB_001016b3:
          putc(0xff,(FILE *)outfile);
          putc(iVar4,(FILE *)outfile);
          uVar6 = read_2_bytes();
          putc(uVar6 >> 8 & 0xff,(FILE *)outfile);
          putc(uVar6 & 0xff,(FILE *)outfile);
          if (uVar6 < 2) goto LAB_001018ae;
          for (iVar4 = uVar6 - 2; iVar4 != 0; iVar4 = iVar4 + -1) {
            iVar5 = read_1_byte();
            putc(iVar5,(FILE *)outfile);
          }
          goto LAB_00101638;
        }
        if (uVar9 != 0x3e) {
          if ((0x200eeefUL >> (uVar9 & 0x3f) & 1) != 0) {
            if (iVar3 != 0) {
              putc(0xff,(FILE *)outfile);
              putc(0xfe,(FILE *)outfile);
              putc(iVar3 + 2U >> 8 & 0xff,(FILE *)outfile);
              putc(iVar3 + 2U & 0xff,(FILE *)outfile);
              lVar13 = 0;
              do {
                putc((int)pcVar11[lVar13],(FILE *)outfile);
                lVar13 = lVar13 + 1;
              } while (iVar3 != (int)lVar13);
            }
            write_marker(iVar4);
            copy_rest_of_file();
            exit(0);
          }
          if (uVar9 == 0x1a) {
            pcVar11 = "SOS without prior SOFn";
            goto LAB_001014fe;
          }
          goto LAB_001016b3;
        }
        if (bVar2) goto LAB_001016b3;
        uVar6 = read_2_bytes();
        if (1 < uVar6) {
          for (iVar4 = uVar6 - 2; iVar4 != 0; iVar4 = iVar4 + -1) {
            read_1_byte();
          }
          goto LAB_00101638;
        }
LAB_001018ae:
        pcVar11 = "Erroneous JPEG marker length";
      }
      else {
        pcVar11 = "Not a JPEG file";
      }
    }
  }
LAB_001014fe:
  fprintf(_stderr,"%s\n",pcVar11);
LAB_001018a4:
  exit(1);
LAB_00101887:
  fprintf(_stderr,"Comment text may not exceed %u bytes\n",65000);
  goto LAB_001018a4;
}

Assistant:

int
main(int argc, char **argv)
{
  int argn;
  char *arg;
  int keep_COM = 1;
  char *comment_arg = NULL;
  FILE *comment_file = NULL;
  unsigned int comment_length = 0;
  int marker;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "wrjpgcom";      /* in case C library doesn't provide it */

  /* Parse switches, if any */
  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (arg[0] != '-')
      break;                    /* not switch, must be file name */
    arg++;                      /* advance over '-' */
    if (keymatch(arg, "replace", 1)) {
      keep_COM = 0;
    } else if (keymatch(arg, "cfile", 2)) {
      if (++argn >= argc) usage();
      if ((comment_file = fopen(argv[argn], "r")) == NULL) {
        fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
        exit(EXIT_FAILURE);
      }
    } else if (keymatch(arg, "comment", 1)) {
      if (++argn >= argc) usage();
      comment_arg = argv[argn];
      /* If the comment text starts with '"', then we are probably running
       * under MS-DOG and must parse out the quoted string ourselves.  Sigh.
       */
      if (comment_arg[0] == '"') {
        comment_arg = (char *)malloc((size_t)MAX_COM_LENGTH);
        if (comment_arg == NULL)
          ERREXIT("Insufficient memory");
        if (strlen(argv[argn]) + 2 >= (size_t)MAX_COM_LENGTH) {
          fprintf(stderr, "Comment text may not exceed %u bytes\n",
                  (unsigned int)MAX_COM_LENGTH);
          exit(EXIT_FAILURE);
        }
        strcpy(comment_arg, argv[argn] + 1);
        for (;;) {
          comment_length = (unsigned int)strlen(comment_arg);
          if (comment_length > 0 && comment_arg[comment_length - 1] == '"') {
            comment_arg[comment_length - 1] = '\0'; /* zap terminating quote */
            break;
          }
          if (++argn >= argc)
            ERREXIT("Missing ending quote mark");
          if (strlen(comment_arg) + strlen(argv[argn]) + 2 >=
              (size_t)MAX_COM_LENGTH) {
            fprintf(stderr, "Comment text may not exceed %u bytes\n",
                    (unsigned int)MAX_COM_LENGTH);
            exit(EXIT_FAILURE);
          }
          strcat(comment_arg, " ");
          strcat(comment_arg, argv[argn]);
        }
      } else if (strlen(argv[argn]) >= (size_t)MAX_COM_LENGTH) {
        fprintf(stderr, "Comment text may not exceed %u bytes\n",
                (unsigned int)MAX_COM_LENGTH);
        exit(EXIT_FAILURE);
      }
      comment_length = (unsigned int)strlen(comment_arg);
    } else
      usage();
  }

  /* Cannot use both -comment and -cfile. */
  if (comment_arg != NULL && comment_file != NULL)
    usage();
  /* If there is neither -comment nor -cfile, we will read the comment text
   * from stdin; in this case there MUST be an input JPEG file name.
   */
  if (comment_arg == NULL && comment_file == NULL && argn >= argc)
    usage();

  /* Open the input file. */
  if (argn < argc) {
    if ((infile = fopen(argv[argn], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
#ifdef USE_SETMODE              /* need to hack file mode? */
    setmode(fileno(stdin), O_BINARY);
#endif
#ifdef USE_FDOPEN               /* need to re-open in binary mode? */
    if ((infile = fdopen(fileno(stdin), READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open stdin\n", progname);
      exit(EXIT_FAILURE);
    }
#else
    infile = stdin;
#endif
  }

  /* Open the output file. */
#ifdef TWO_FILE_COMMANDLINE
  /* Must have explicit output file name */
  if (argn != argc - 2) {
    fprintf(stderr, "%s: must name one input and one output file\n", progname);
    usage();
  }
  if ((outfile = fopen(argv[argn + 1], WRITE_BINARY)) == NULL) {
    fprintf(stderr, "%s: can't open %s\n", progname, argv[argn + 1]);
    exit(EXIT_FAILURE);
  }
#else
  /* Unix style: expect zero or one file name */
  if (argn < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
  /* default output file is stdout */
#ifdef USE_SETMODE              /* need to hack file mode? */
  setmode(fileno(stdout), O_BINARY);
#endif
#ifdef USE_FDOPEN               /* need to re-open in binary mode? */
  if ((outfile = fdopen(fileno(stdout), WRITE_BINARY)) == NULL) {
    fprintf(stderr, "%s: can't open stdout\n", progname);
    exit(EXIT_FAILURE);
  }
#else
  outfile = stdout;
#endif
#endif /* TWO_FILE_COMMANDLINE */

  /* Collect comment text from comment_file or stdin, if necessary */
  if (comment_arg == NULL) {
    FILE *src_file;
    int c;

    comment_arg = (char *)malloc((size_t)MAX_COM_LENGTH);
    if (comment_arg == NULL)
      ERREXIT("Insufficient memory");
    comment_length = 0;
    src_file = (comment_file != NULL ? comment_file : stdin);
    while ((c = getc(src_file)) != EOF) {
      if (comment_length >= (unsigned int)MAX_COM_LENGTH) {
        fprintf(stderr, "Comment text may not exceed %u bytes\n",
                (unsigned int)MAX_COM_LENGTH);
        exit(EXIT_FAILURE);
      }
      comment_arg[comment_length++] = (char)c;
    }
    if (comment_file != NULL)
      fclose(comment_file);
  }

  /* Copy JPEG headers until SOFn marker;
   * we will insert the new comment marker just before SOFn.
   * This (a) causes the new comment to appear after, rather than before,
   * existing comments; and (b) ensures that comments come after any JFIF
   * or JFXX markers, as required by the JFIF specification.
   */
  marker = scan_JPEG_header(keep_COM);
  /* Insert the new COM marker, but only if nonempty text has been supplied */
  if (comment_length > 0) {
    write_marker(M_COM);
    write_2_bytes(comment_length + 2);
    while (comment_length > 0) {
      write_1_byte(*comment_arg++);
      comment_length--;
    }
  }
  /* Duplicate the remainder of the source file.
   * Note that any COM markers occurring after SOF will not be touched.
   */
  write_marker(marker);
  copy_rest_of_file();

  /* All done. */
  exit(EXIT_SUCCESS);
  return 0;                     /* suppress no-return-value warnings */
}